

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O2

void do_pseudo(int *ip)

{
  int iVar1;
  ulong uVar2;
  char str [80];
  char acStack_78 [88];
  
  if (((uint)(int)pseudo_flag[opval] >> (section & 0x1fU) & 1) == 0) {
    fatal_error("Directive not allowed in the current section!");
  }
  iVar1 = bank;
  (*opproc)(ip);
  uVar2 = (ulong)(uint)opval;
  if (uVar2 < 0x34) {
    if ((0xc000000000003U >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x600000000U >> (uVar2 & 0x3f) & 1) != 0) goto LAB_00109d79;
      goto LAB_00109de9;
    }
    if ((lastlabl == (t_symbol *)0x0) || (lastlabl->data_type == 0)) goto LAB_00109d79;
  }
  else {
LAB_00109de9:
    if ((lastlabl == (t_symbol *)0x0) || (lastlabl->data_type == opval)) goto LAB_00109d79;
  }
  lastlabl = (t_symbol *)0x0;
LAB_00109d79:
  if ((((pass == 1) && (asm_opt[2] != 0)) && ((uint)opval < 0x2c)) &&
     ((((0xc0000001e80U >> (uVar2 & 0x3f) & 1) != 0 && (bank != iVar1)) &&
      ((bank + ~iVar1) * 0x2000 + loccnt != 0)))) {
    sprintf(acStack_78,"Warning, bank overflow by %i bytes!\n");
    warning(acStack_78);
  }
  return;
}

Assistant:

void
do_pseudo(int *ip)
{
	char str[80];
	int old_bank;
	int size;
	char check_opval_flag;                  //internal debug var

	check_opval_flag = pseudo_flag[opval];  //internal debug var

	/* check if the directive is allowed in the current section */
	if (!(pseudo_flag[opval] & (1 << section)))
	{
		fatal_error("Directive not allowed in the current section!");
	}

	/* save current location */
	old_bank = bank;

	/* execute directive */
	opproc(ip);

	/* reset last label pointer */
	switch (opval) {
	case P_VRAM:
	case P_PAL:
		break;

	case P_DB:
	case P_DW:
	case P_DWL:
	case P_DWH:
		if (lastlabl) {
			if(lastlabl->data_type != P_DB)
		 	   lastlabl = NULL;
		}
		break;

	default:
		if (lastlabl) {
			if(lastlabl->data_type != opval)
		 	   lastlabl = NULL;
		}
		break;
	}

	/* bank overflow warning */
	if (pass == LAST_PASS) {
		if (asm_opt[OPT_WARNING]) {
			switch (opval) {
			case P_INCBIN:
			case P_INCCHR:
			case P_INCSPR:
			case P_INCPAL:
			case P_INCBAT:
			case P_INCTILE:
			case P_INCMAP:
				if (bank != old_bank) {
					size = ((bank - old_bank - 1) * 8192) + loccnt;
					if (size) {
						sprintf(str, "Warning, bank overflow by %i bytes!\n", size);
						warning(str);
					}
				}
				break;
			}
		}
	}
}